

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * __thiscall Matrix::operator*(Matrix *__return_storage_ptr__,Matrix *this,Matrix *mat)

{
  pointer pvVar1;
  long lVar2;
  pointer pvVar3;
  uint i;
  ulong uVar4;
  ulong uVar5;
  pointer pvVar6;
  uint j;
  ulong uVar7;
  double dVar8;
  
  if ((this->m_shape).field_0.m_dims[1] == (mat->m_shape).field_0.m_dims[0]) {
    Matrix(__return_storage_ptr__,(this->m_shape).field_0.m_dims[0],(mat->m_shape).field_0.m_dims[1]
          );
    for (uVar4 = 0; uVar4 < (this->m_shape).field_0.m_dims[0]; uVar4 = uVar4 + 1) {
      pvVar1 = (__return_storage_ptr__->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar5 = 0; uVar5 < (mat->m_shape).field_0.m_dims[1]; uVar5 = uVar5 + 1) {
        lVar2 = *(long *)&pvVar1[uVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl;
        *(undefined8 *)(lVar2 + uVar5 * 8) = 0;
        pvVar3 = (this->m_vals).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar6 = (mat->m_vals).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar8 = 0.0;
        for (uVar7 = 0; uVar7 < (this->m_shape).field_0.m_dims[1]; uVar7 = uVar7 + 1) {
          dVar8 = dVar8 + *(double *)
                           (*(long *)&pvVar3[uVar4].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           uVar7 * 8) *
                          *(double *)
                           (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl + uVar5 * 8);
          *(double *)(lVar2 + uVar5 * 8) = dVar8;
          pvVar6 = pvVar6 + 1;
        }
      }
    }
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [* operator]: Shape doesn\'t match!\n");
  exit(1);
}

Assistant:

Matrix Matrix::operator*(const Matrix& mat) const{
    if(m_shape.n_col!=mat.m_shape.n_row){
        std::cout<<"ERROR [* operator]: Shape doesn't match!\n";
        exit(1);
    }
    Matrix result(m_shape.n_row, mat.m_shape.n_col);
    
    for(uint i=0;i<m_shape.n_row;++i){
        for(uint t=0;t<mat.m_shape.n_col;++t){
            result.m_vals[i][t]=0;
            for(uint j=0;j<m_shape.n_col;++j){
                result.m_vals[i][t]+=m_vals[i][j]*mat.m_vals[j][t];
            }
        }
    }
    // std::cout<<"+\n";
    return result;
}